

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2wat.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  wabt *this;
  ReadBinaryOptions *callback;
  uint uVar3;
  string_view filename;
  string_view filename_00;
  ValidateOptions options_1;
  WriteWatOptions local_468;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  ReadBinaryOptions options;
  OptionParser parser;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm2wat",
             "  Read a file in the WebAssembly binary format, and convert it to\n  the WebAssembly text format.\n\nexamples:\n  # parse binary file test.wasm and write text file test.wast\n  $ wasm2wat test.wasm -o test.wat\n\n  # parse test.wasm, write test.wat, but ignore the debug names, if any\n  $ wasm2wat test.wasm --no-debug-names -o test.wat\n"
            );
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the generated wast file, by default use stdout",(Callback *)&options_1
            );
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,'f',"fold-exprs","Write folded expressions where possible",
             (NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"inline-exports","Write all exports inline",(NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"inline-imports","Write all imports inline",(NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"ignore-custom-section-errors","Ignore errors in custom sections",
             (NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"generate-names",
             "Give auto-generated names to non-named functions, types, etc.",
             (NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  options_1.features.extended_const_enabled_ = true;
  options_1.features.relaxed_simd_enabled_ = true;
  options_1.features.custom_page_sizes_enabled_ = true;
  wabt::OptionParser::AddOption
            (&parser,"no-check","Don\'t check for invalid modules",(NullCallback *)&options_1);
  if ((code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_)
      != (code *)0x0) {
    (*(code *)(ulong)CONCAT21(options_1.features._17_2_,options_1.features.extended_const_enabled_))
              (&options_1,&options_1,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options_1,"filename",(allocator<char> *)&file_data);
  callback = &options;
  options.features.exceptions_enabled_ = false;
  options.features.mutable_globals_enabled_ = false;
  options.features.sat_float_to_int_enabled_ = false;
  options.features.sign_extension_enabled_ = false;
  options.features.simd_enabled_ = false;
  options.features.threads_enabled_ = false;
  options.features.function_references_enabled_ = false;
  options.features.multi_value_enabled_ = false;
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2wat.cc:95:22)>
       ::_M_invoke;
  options.features.multi_memory_enabled_ = false;
  options.features.extended_const_enabled_ = true;
  options.features.relaxed_simd_enabled_ = true;
  options.features.custom_page_sizes_enabled_ = true;
  options._19_5_ = 0;
  wabt::OptionParser::AddArgument(&parser,(string *)&options_1,One,(Callback *)callback);
  if ((code *)CONCAT53(options._19_5_,options.features._16_3_) != (code *)0x0) {
    (*(code *)CONCAT53(options._19_5_,options.features._16_3_))(&options,&options,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  _Var1 = s_infile_abi_cxx11_._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar2.enum_ == Ok) {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::Module::Module((Module *)&parser);
    options.read_debug_names = (bool)(s_read_debug_names ^ 1);
    options.fail_on_custom_section_error = (bool)(s_fail_on_custom_section_error ^ 1);
    options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    options.features.simd_enabled_ = s_features.simd_enabled_;
    options.features.threads_enabled_ = s_features.threads_enabled_;
    options.features.function_references_enabled_ = s_features.function_references_enabled_;
    options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    options.features.annotations_enabled_ = s_features.annotations_enabled_;
    options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    options.features.gc_enabled_ = s_features.gc_enabled_;
    options.features.memory64_enabled_ = s_features.memory64_enabled_;
    options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    options.features.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
    options.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    options.stop_on_first_error = true;
    options.skip_function_bodies = false;
    RVar2 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                               file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&options,&errors,
                               (Module *)&parser);
    uVar3 = 1;
    if (RVar2.enum_ == Ok) {
      RVar2.enum_ = Ok;
      if (s_validate == '\0') {
        options_1.features.extended_const_enabled_ = s_features.extended_const_enabled_;
        options_1.features._17_2_ = s_features._17_2_;
        options_1.features.exceptions_enabled_ = s_features.exceptions_enabled_;
        options_1.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
        options_1.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
        options_1.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
        options_1.features.simd_enabled_ = s_features.simd_enabled_;
        options_1.features.threads_enabled_ = s_features.threads_enabled_;
        options_1.features.function_references_enabled_ = s_features.function_references_enabled_;
        options_1.features.multi_value_enabled_ = s_features.multi_value_enabled_;
        options_1.features.tail_call_enabled_ = s_features.tail_call_enabled_;
        options_1.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
        options_1.features.reference_types_enabled_ = s_features.reference_types_enabled_;
        options_1.features.annotations_enabled_ = s_features.annotations_enabled_;
        options_1.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
        options_1.features.gc_enabled_ = s_features.gc_enabled_;
        options_1.features.memory64_enabled_ = s_features.memory64_enabled_;
        options_1.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
        RVar2 = wabt::ValidateModule((Module *)&parser,&errors,&options_1);
      }
      if (s_generate_names == '\x01') {
        RVar2 = wabt::GenerateNames((Module *)&parser,None);
      }
      if (RVar2.enum_ == Ok) {
        wabt::ApplyNames((Module *)&parser);
        local_468.features.exceptions_enabled_ = s_features.exceptions_enabled_;
        local_468.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
        local_468.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
        local_468.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
        local_468.features.simd_enabled_ = s_features.simd_enabled_;
        local_468.features.threads_enabled_ = s_features.threads_enabled_;
        local_468.features.function_references_enabled_ = s_features.function_references_enabled_;
        local_468.features.multi_value_enabled_ = s_features.multi_value_enabled_;
        local_468.features.tail_call_enabled_ = s_features.tail_call_enabled_;
        local_468.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
        local_468.features.reference_types_enabled_ = s_features.reference_types_enabled_;
        local_468.features.annotations_enabled_ = s_features.annotations_enabled_;
        local_468.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
        local_468.features.gc_enabled_ = s_features.gc_enabled_;
        local_468.features.memory64_enabled_ = s_features.memory64_enabled_;
        local_468.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
        local_468.features.extended_const_enabled_ = s_features.extended_const_enabled_;
        local_468.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
        local_468.features.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
        local_468.fold_exprs = (bool)s_fold_exprs;
        local_468.inline_import = (bool)s_inline_import;
        local_468.inline_export = (bool)s_inline_export;
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          wabt::FileStream::FileStream((FileStream *)&options_1,_stdout,(Stream *)0x0);
        }
        else {
          filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
          filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
          wabt::FileStream::FileStream((FileStream *)&options_1,filename_00,(Stream *)0x0);
        }
        RVar2 = wabt::WriteWat((Stream *)&options_1,(Module *)&parser,&local_468);
        wabt::FileStream::~FileStream((FileStream *)&options_1);
        uVar3 = (uint)(RVar2.enum_ != Ok);
      }
    }
    options_1.features._0_8_ = &options_1.features.extended_const_enabled_;
    options_1.features.tail_call_enabled_ = false;
    options_1.features.bulk_memory_enabled_ = false;
    options_1.features.reference_types_enabled_ = false;
    options_1.features.annotations_enabled_ = false;
    options_1.features.code_metadata_enabled_ = false;
    options_1.features.gc_enabled_ = false;
    options_1.features.memory64_enabled_ = false;
    options_1.features.multi_memory_enabled_ = false;
    options_1.features.extended_const_enabled_ = false;
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&options_1,Never,0x50);
    std::__cxx11::string::_M_dispose();
    wabt::Module::~Module((Module *)&parser);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  else {
    uVar3 = 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar3;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result) && s_validate) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
      }

      if (s_generate_names) {
        result = GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        WriteWatOptions wat_options(s_features);
        wat_options.fold_exprs = s_fold_exprs;
        wat_options.inline_import = s_inline_import;
        wat_options.inline_export = s_inline_export;
        FileStream stream(!s_outfile.empty() ? FileStream(s_outfile)
                                             : FileStream(stdout));
        result = WriteWat(&stream, &module, wat_options);
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}